

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O3

tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *
generate_list<trng::mrg5>
          (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,mrg5 *r1,mrg5 *r2,long N,long skip1,long skip2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  int local_d4;
  long local_d0;
  ulong local_c8;
  mrg5 *local_c0;
  mrg5 *local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_68;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_c0 = r2;
  local_b8 = r1;
  local_50 = (_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  local_48 = N;
  local_40 = skip1;
  local_38 = skip2;
  if (0 < N) {
    std::vector<int,_std::allocator<int>_>::reserve(&local_68,N);
    std::vector<int,_std::allocator<int>_>::reserve(&local_88,N);
    lVar6 = 0;
    local_c8 = 0xfffffffd;
    do {
      iVar5 = (local_b8->S).r[0];
      iVar1 = (local_b8->S).r[1];
      iVar2 = (local_b8->S).r[2];
      iVar8 = (local_b8->S).r[3];
      uVar9 = (long)(local_b8->P).a[3] * (long)iVar8 + (long)(local_b8->P).a[2] * (long)iVar2 +
              (long)(local_b8->P).a[1] * (long)iVar1 + (long)(local_b8->P).a[0] * (long)iVar5;
      uVar10 = uVar9 + 0x80000001fffffffe;
      if (uVar9 < 0x7ffffffe00000002) {
        uVar10 = uVar9;
      }
      uVar10 = (long)(local_b8->S).r[4] * (long)(local_b8->P).a[4] + uVar10;
      (local_b8->S).r[4] = iVar8;
      (local_b8->S).r[3] = iVar2;
      uVar9 = (uVar10 >> 0x1f) + (uVar10 & 0x7fffffff);
      uVar10 = uVar9 - 0x1fffffffc;
      if (uVar9 < 0x1fffffffc) {
        uVar10 = uVar9;
      }
      (local_b8->S).r[2] = iVar1;
      (local_b8->S).r[1] = iVar5;
      uVar9 = uVar10 - 0xfffffffe;
      if (uVar10 <= local_c8) {
        uVar9 = uVar10;
      }
      local_d4 = (int)uVar9 + -0x7fffffff;
      if (uVar9 < 0x7fffffff) {
        local_d4 = (int)uVar9;
      }
      (local_b8->S).r[0] = local_d4;
      local_d0 = lVar6;
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_d4);
      }
      else {
        *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_d4;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar5 = (local_c0->S).r[0];
      iVar1 = (local_c0->S).r[1];
      iVar2 = (local_c0->S).r[2];
      iVar8 = (local_c0->S).r[3];
      uVar9 = (long)(local_c0->P).a[3] * (long)iVar8 + (long)(local_c0->P).a[2] * (long)iVar2 +
              (long)(local_c0->P).a[1] * (long)iVar1 + (long)(local_c0->P).a[0] * (long)iVar5;
      uVar10 = uVar9 + 0x80000001fffffffe;
      if (uVar9 < 0x7ffffffe00000002) {
        uVar10 = uVar9;
      }
      uVar10 = (long)(local_c0->S).r[4] * (long)(local_c0->P).a[4] + uVar10;
      (local_c0->S).r[4] = iVar8;
      (local_c0->S).r[3] = iVar2;
      uVar9 = (uVar10 >> 0x1f) + (uVar10 & 0x7fffffff);
      uVar10 = uVar9 - 0x1fffffffc;
      if (uVar9 < 0x1fffffffc) {
        uVar10 = uVar9;
      }
      (local_c0->S).r[2] = iVar1;
      (local_c0->S).r[1] = iVar5;
      uVar9 = uVar10 - 0xfffffffe;
      if (uVar10 <= local_c8) {
        uVar9 = uVar10;
      }
      local_d4 = (int)uVar9 + -0x7fffffff;
      if (uVar9 < 0x7fffffff) {
        local_d4 = (int)uVar9;
      }
      (local_c0->S).r[0] = local_d4;
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_d4);
      }
      else {
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_d4;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (0 < local_40) {
        local_90 = (long)(local_b8->P).a[0];
        local_98 = (long)(local_b8->P).a[1];
        local_a0 = (long)(local_b8->P).a[2];
        local_a8 = (long)(local_b8->P).a[3];
        local_b0 = (long)(local_b8->P).a[4];
        lVar6 = local_40;
        iVar5 = (local_b8->S).r[4];
        iVar1 = (local_b8->S).r[3];
        iVar2 = (local_b8->S).r[2];
        iVar8 = (local_b8->S).r[0];
        iVar7 = (local_b8->S).r[1];
        do {
          iVar3 = iVar7;
          iVar7 = iVar8;
          iVar11 = iVar2;
          iVar4 = iVar1;
          uVar9 = iVar4 * local_a8 + iVar11 * local_a0 + iVar3 * local_98 + iVar7 * local_90;
          uVar10 = uVar9 + 0x80000001fffffffe;
          if (uVar9 < 0x7ffffffe00000002) {
            uVar10 = uVar9;
          }
          uVar10 = iVar5 * local_b0 + uVar10;
          uVar9 = (uVar10 >> 0x1f) + (uVar10 & 0x7fffffff);
          uVar10 = uVar9 - 0x1fffffffc;
          if (uVar9 < 0x1fffffffc) {
            uVar10 = uVar9;
          }
          uVar9 = uVar10 - 0xfffffffe;
          if (uVar10 <= local_c8) {
            uVar9 = uVar10;
          }
          iVar8 = (int)uVar9 + -0x7fffffff;
          if (uVar9 < 0x7fffffff) {
            iVar8 = (int)uVar9;
          }
          lVar6 = lVar6 + -1;
          iVar5 = iVar4;
          iVar1 = iVar11;
          iVar2 = iVar3;
        } while (lVar6 != 0);
        (local_b8->S).r[4] = iVar4;
        (local_b8->S).r[3] = iVar11;
        (local_b8->S).r[2] = iVar3;
        (local_b8->S).r[1] = iVar7;
        (local_b8->S).r[0] = iVar8;
      }
      if (0 < local_38) {
        local_90 = (long)(local_c0->P).a[0];
        local_98 = (long)(local_c0->P).a[1];
        local_a0 = (long)(local_c0->P).a[2];
        local_a8 = (long)(local_c0->P).a[3];
        local_b0 = (long)(local_c0->P).a[4];
        lVar6 = local_38;
        iVar5 = (local_c0->S).r[4];
        iVar1 = (local_c0->S).r[3];
        iVar2 = (local_c0->S).r[2];
        iVar8 = (local_c0->S).r[0];
        iVar7 = (local_c0->S).r[1];
        do {
          iVar11 = iVar7;
          iVar7 = iVar8;
          iVar3 = iVar2;
          iVar4 = iVar1;
          uVar9 = iVar4 * local_a8 + iVar3 * local_a0 + iVar11 * local_98 + iVar7 * local_90;
          uVar10 = uVar9 + 0x80000001fffffffe;
          if (uVar9 < 0x7ffffffe00000002) {
            uVar10 = uVar9;
          }
          uVar10 = iVar5 * local_b0 + uVar10;
          uVar9 = (uVar10 >> 0x1f) + (uVar10 & 0x7fffffff);
          uVar10 = uVar9 - 0x1fffffffc;
          if (uVar9 < 0x1fffffffc) {
            uVar10 = uVar9;
          }
          uVar9 = uVar10 - 0xfffffffe;
          if (uVar10 <= local_c8) {
            uVar9 = uVar10;
          }
          iVar8 = (int)uVar9 + -0x7fffffff;
          if (uVar9 < 0x7fffffff) {
            iVar8 = (int)uVar9;
          }
          lVar6 = lVar6 + -1;
          iVar5 = iVar4;
          iVar1 = iVar3;
          iVar2 = iVar11;
        } while (lVar6 != 0);
        (local_c0->S).r[4] = iVar4;
        (local_c0->S).r[3] = iVar3;
        (local_c0->S).r[2] = iVar11;
        (local_c0->S).r[1] = iVar7;
        (local_c0->S).r[0] = iVar8;
      }
      lVar6 = local_d0 + 1;
    } while (lVar6 != local_48);
  }
  std::_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,void>
            (local_50,&local_68,&local_88);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *)
         local_50;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}